

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLURL.cpp
# Opt level: O1

void __thiscall xercesc_4_0::XMLURL::XMLURL(XMLURL *this,XMLURL *toCopy)

{
  short *psVar1;
  MemoryManager *pMVar2;
  XMLCh *pXVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  size_t sVar6;
  CleanupType_conflict6 cleanup;
  JanitorMemFunCall<xercesc_4_0::XMLURL> local_40;
  XMLCh *pXVar5;
  
  this->_vptr_XMLURL = (_func_int **)&PTR__XMLURL_0040d490;
  pMVar2 = toCopy->fMemoryManager;
  this->fMemoryManager = pMVar2;
  this->fFragment = (XMLCh *)0x0;
  this->fHost = (XMLCh *)0x0;
  this->fPassword = (XMLCh *)0x0;
  this->fPath = (XMLCh *)0x0;
  this->fPortNum = toCopy->fPortNum;
  this->fProtocol = toCopy->fProtocol;
  this->fQuery = (XMLCh *)0x0;
  this->fUser = (XMLCh *)0x0;
  pXVar5 = (XMLCh *)0x0;
  this->fURLText = (XMLCh *)0x0;
  this->fHasInvalidChar = toCopy->fHasInvalidChar;
  local_40.fToCall = (MFPT)cleanUp;
  local_40._16_8_ = 0;
  pXVar3 = toCopy->fFragment;
  local_40.fObject = this;
  if (pXVar3 != (XMLCh *)0x0) {
    sVar6 = 0;
    do {
      psVar1 = (short *)((long)pXVar3 + sVar6);
      sVar6 = sVar6 + 2;
    } while (*psVar1 != 0);
    iVar4 = (*pMVar2->_vptr_MemoryManager[3])(pMVar2,sVar6);
    pXVar5 = (XMLCh *)CONCAT44(extraout_var,iVar4);
    memcpy(pXVar5,pXVar3,sVar6);
  }
  this->fFragment = pXVar5;
  pXVar3 = toCopy->fHost;
  if (pXVar3 == (XMLCh *)0x0) {
    pXVar5 = (XMLCh *)0x0;
  }
  else {
    sVar6 = 0;
    do {
      psVar1 = (short *)((long)pXVar3 + sVar6);
      sVar6 = sVar6 + 2;
    } while (*psVar1 != 0);
    iVar4 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,sVar6);
    pXVar5 = (XMLCh *)CONCAT44(extraout_var_00,iVar4);
    memcpy(pXVar5,pXVar3,sVar6);
  }
  this->fHost = pXVar5;
  pXVar3 = toCopy->fPassword;
  if (pXVar3 == (XMLCh *)0x0) {
    pXVar5 = (XMLCh *)0x0;
  }
  else {
    sVar6 = 0;
    do {
      psVar1 = (short *)((long)pXVar3 + sVar6);
      sVar6 = sVar6 + 2;
    } while (*psVar1 != 0);
    iVar4 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,sVar6);
    pXVar5 = (XMLCh *)CONCAT44(extraout_var_01,iVar4);
    memcpy(pXVar5,pXVar3,sVar6);
  }
  this->fPassword = pXVar5;
  pXVar3 = toCopy->fPath;
  if (pXVar3 == (XMLCh *)0x0) {
    pXVar5 = (XMLCh *)0x0;
  }
  else {
    sVar6 = 0;
    do {
      psVar1 = (short *)((long)pXVar3 + sVar6);
      sVar6 = sVar6 + 2;
    } while (*psVar1 != 0);
    iVar4 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,sVar6);
    pXVar5 = (XMLCh *)CONCAT44(extraout_var_02,iVar4);
    memcpy(pXVar5,pXVar3,sVar6);
  }
  this->fPath = pXVar5;
  pXVar3 = toCopy->fQuery;
  if (pXVar3 == (XMLCh *)0x0) {
    pXVar5 = (XMLCh *)0x0;
  }
  else {
    sVar6 = 0;
    do {
      psVar1 = (short *)((long)pXVar3 + sVar6);
      sVar6 = sVar6 + 2;
    } while (*psVar1 != 0);
    iVar4 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,sVar6);
    pXVar5 = (XMLCh *)CONCAT44(extraout_var_03,iVar4);
    memcpy(pXVar5,pXVar3,sVar6);
  }
  this->fQuery = pXVar5;
  pXVar3 = toCopy->fUser;
  if (pXVar3 == (XMLCh *)0x0) {
    pXVar5 = (XMLCh *)0x0;
  }
  else {
    sVar6 = 0;
    do {
      psVar1 = (short *)((long)pXVar3 + sVar6);
      sVar6 = sVar6 + 2;
    } while (*psVar1 != 0);
    iVar4 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,sVar6);
    pXVar5 = (XMLCh *)CONCAT44(extraout_var_04,iVar4);
    memcpy(pXVar5,pXVar3,sVar6);
  }
  this->fUser = pXVar5;
  pXVar3 = toCopy->fURLText;
  if (pXVar3 == (XMLCh *)0x0) {
    pXVar5 = (XMLCh *)0x0;
  }
  else {
    sVar6 = 0;
    do {
      psVar1 = (short *)((long)pXVar3 + sVar6);
      sVar6 = sVar6 + 2;
    } while (*psVar1 != 0);
    iVar4 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,sVar6);
    pXVar5 = (XMLCh *)CONCAT44(extraout_var_05,iVar4);
    memcpy(pXVar5,pXVar3,sVar6);
  }
  this->fURLText = pXVar5;
  local_40.fObject = (XMLURL *)0x0;
  JanitorMemFunCall<xercesc_4_0::XMLURL>::~JanitorMemFunCall(&local_40);
  return;
}

Assistant:

XMLURL::XMLURL(const XMLURL& toCopy) :
    XMemory(toCopy)
    , fMemoryManager(toCopy.fMemoryManager)
    , fFragment(0)
    , fHost(0)
    , fPassword(0)
    , fPath(0)
    , fPortNum(toCopy.fPortNum)
    , fProtocol(toCopy.fProtocol)
    , fQuery(0)
    , fUser(0)
    , fURLText(0)
    , fHasInvalidChar(toCopy.fHasInvalidChar)
{
    CleanupType cleanup(this, &XMLURL::cleanUp);

    try
    {
        fFragment = XMLString::replicate(toCopy.fFragment, fMemoryManager);
        fHost = XMLString::replicate(toCopy.fHost, fMemoryManager);
        fPassword = XMLString::replicate(toCopy.fPassword, fMemoryManager);
        fPath = XMLString::replicate(toCopy.fPath, fMemoryManager);
        fQuery = XMLString::replicate(toCopy.fQuery, fMemoryManager);
        fUser = XMLString::replicate(toCopy.fUser, fMemoryManager);
        fURLText = XMLString::replicate(toCopy.fURLText, fMemoryManager);
    }
    catch(const OutOfMemoryException&)
    {
        cleanup.release();

        throw;
    }

    cleanup.release();
}